

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::Dump(GenericSoundEssenceDescriptor *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [128];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  FileDescriptor::Dump(&this->super_FileDescriptor,stream);
  pcVar1 = Rational::EncodeString(&this->AudioSamplingRate,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","AudioSamplingRate",pcVar1);
  fprintf((FILE *)stream,"  %22s = %d\n","Locked",(ulong)this->Locked);
  if ((this->AudioRefLevel).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","AudioRefLevel",(ulong)(this->AudioRefLevel).m_property);
  }
  if ((this->ElectroSpatialFormulation).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","ElectroSpatialFormulation",
            (ulong)(this->ElectroSpatialFormulation).m_property);
  }
  fprintf((FILE *)stream,"  %22s = %d\n","ChannelCount",(ulong)this->ChannelCount);
  fprintf((FILE *)stream,"  %22s = %d\n","QuantizationBits",(ulong)this->QuantizationBits);
  if ((this->DialNorm).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","DialNorm",(ulong)(this->DialNorm).m_property);
  }
  pcVar1 = UL::EncodeString(&this->SoundEssenceCoding,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","SoundEssenceCoding",pcVar1);
  if ((this->ReferenceAudioAlignmentLevel).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","ReferenceAudioAlignmentLevel",
            (ulong)(this->ReferenceAudioAlignmentLevel).m_property);
  }
  if ((this->ReferenceImageEditRate).m_has_value == true) {
    pcVar1 = Rational::EncodeString(&(this->ReferenceImageEditRate).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","ReferenceImageEditRate",pcVar1);
  }
  return;
}

Assistant:

void
GenericSoundEssenceDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  FileDescriptor::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "AudioSamplingRate", AudioSamplingRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %d\n",  "Locked", Locked);
  if ( ! AudioRefLevel.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "AudioRefLevel", AudioRefLevel.get());
  }
  if ( ! ElectroSpatialFormulation.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "ElectroSpatialFormulation", ElectroSpatialFormulation.get());
  }
  fprintf(stream, "  %22s = %d\n",  "ChannelCount", ChannelCount);
  fprintf(stream, "  %22s = %d\n",  "QuantizationBits", QuantizationBits);
  if ( ! DialNorm.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "DialNorm", DialNorm.get());
  }
  fprintf(stream, "  %22s = %s\n",  "SoundEssenceCoding", SoundEssenceCoding.EncodeString(identbuf, IdentBufferLen));
  if ( ! ReferenceAudioAlignmentLevel.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "ReferenceAudioAlignmentLevel", ReferenceAudioAlignmentLevel.get());
  }
  if ( ! ReferenceImageEditRate.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "ReferenceImageEditRate", ReferenceImageEditRate.get().EncodeString(identbuf, IdentBufferLen));
  }
}